

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

bool __thiscall
CAPSFile::ReadRecordHeader(CAPSFile *this,uchar *buffer,RecordHeader *header_out,size_t size)

{
  uint uVar1;
  uchar *buffer_00;
  uint crc;
  uchar *buffer_to_check;
  size_t size_local;
  RecordHeader *header_out_local;
  uchar *buffer_local;
  CAPSFile *this_local;
  
  *(undefined4 *)header_out->type = *(undefined4 *)buffer;
  uVar1 = ExtractInt(buffer + 4);
  header_out->length = uVar1;
  uVar1 = ExtractInt(buffer + 8);
  header_out->crc = uVar1;
  if (size < header_out->length) {
    this_local._7_1_ = false;
  }
  else {
    buffer_00 = (uchar *)operator_new__((ulong)header_out->length);
    memcpy(buffer_00,buffer,(ulong)header_out->length);
    memset(buffer_00 + 8,0,4);
    uVar1 = CRC::ComputeCrc32(0xedb88320,buffer_00,header_out->length);
    if (buffer_00 != (uchar *)0x0) {
      operator_delete__(buffer_00);
    }
    this_local._7_1_ = uVar1 == header_out->crc;
  }
  return this_local._7_1_;
}

Assistant:

bool CAPSFile::ReadRecordHeader(const unsigned char* buffer, RecordHeader* header_out, size_t size)
{
   memcpy(header_out->type, &buffer[0], 4);
   header_out->length = ExtractInt(&buffer[4]);
   header_out->crc = ExtractInt(&buffer[8]);

   // Copy buffer to check
   if (header_out->length > size) return false;

   unsigned char* buffer_to_check = new unsigned char[header_out->length];
   memcpy(buffer_to_check, buffer, header_out->length);
   // Check the CRC
   memset(&buffer_to_check[8], 0, 4);

   unsigned int crc = CRC::ComputeCrc32(0xEDB88320, buffer_to_check, header_out->length);
   delete[] buffer_to_check;

   return (crc == header_out->crc);
}